

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateNotationUse(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *notationName)

{
  xmlNotationPtr pxVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((doc != (xmlDocPtr)0x0) &&
     (notationName != (xmlChar *)0x0 && doc->intSubset != (xmlDtdPtr)0x0)) {
    pxVar1 = xmlGetDtdNotationDesc(doc->intSubset,notationName);
    iVar2 = 1;
    if (pxVar1 == (xmlNotationPtr)0x0) {
      if ((doc->extSubset != (xmlDtdPtr)0x0) &&
         (pxVar1 = xmlGetDtdNotationDesc(doc->extSubset,notationName), pxVar1 != (xmlNotationPtr)0x0
         )) {
        return 1;
      }
      iVar2 = 0;
      xmlErrValidNode(ctxt,(xmlNodePtr)doc,XML_DTD_UNKNOWN_NOTATION,"NOTATION %s is not declared\n",
                      notationName,(xmlChar *)0x0,(xmlChar *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int
xmlValidateNotationUse(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       const xmlChar *notationName) {
    xmlNotationPtr notaDecl;
    if ((doc == NULL) || (doc->intSubset == NULL) ||
        (notationName == NULL)) return(-1);

    notaDecl = xmlGetDtdNotationDesc(doc->intSubset, notationName);
    if ((notaDecl == NULL) && (doc->extSubset != NULL))
	notaDecl = xmlGetDtdNotationDesc(doc->extSubset, notationName);

    if (notaDecl == NULL) {
	xmlErrValidNode(ctxt, (xmlNodePtr) doc, XML_DTD_UNKNOWN_NOTATION,
	                "NOTATION %s is not declared\n",
		        notationName, NULL, NULL);
	return(0);
    }
    return(1);
}